

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

Dim * __thiscall
cnn::KMaxPooling::dim_forward
          (Dim *__return_storage_ptr__,KMaxPooling *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  pointer pDVar3;
  long lVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  uint local_18 [2];
  
  local_18[1] = this->k;
  if (local_18[1] == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad bad k in KMaxPooling: ",0x1a);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad k in KMaxPooling");
  }
  else {
    pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pDVar3->nd == 2) && (local_18[1] <= pDVar3->d[1])) {
      local_18[0] = pDVar3->d[0];
      __return_storage_ptr__->nd = 0;
      __return_storage_ptr__->bd = 1;
      lVar4 = 0;
      do {
        uVar1 = *(uint *)((long)local_18 + lVar4);
        uVar2 = __return_storage_ptr__->nd;
        __return_storage_ptr__->nd = uVar2 + 1;
        __return_storage_ptr__->d[uVar2] = uVar1;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 8);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad input dimensions in KMaxPooling: ",0x25);
    poVar5 = operator<<((ostream *)&std::cerr,xs);
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad input dimensions in KMaxPooling");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim KMaxPooling::dim_forward(const vector<Dim>& xs) const {
  if (k < 1) {
    cerr << "Bad bad k in KMaxPooling: " << k << endl;
    throw std::invalid_argument("bad k in KMaxPooling");
  }
  if (xs[0].ndims() != 2 || (xs[0].cols() < k)) {
    cerr << "Bad input dimensions in KMaxPooling: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in KMaxPooling");
  }
  return Dim({xs[0].rows(), k});
}